

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_initially_no_subjects_are_currently_subscribed_Test::TestBody
          (SubjectSetRegisterTest_initially_no_subjects_are_currently_subscribed_Test *this)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  string local_188;
  AssertHelper local_168;
  Message local_160;
  bool local_151;
  undefined1 local_150 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_120;
  Message local_118;
  bool local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_d8;
  Message local_d0 [3];
  bool local_b1;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_;
  SubjectSetRegister subject_register;
  SubjectSetRegisterTest_initially_no_subjects_are_currently_subscribed_Test *this_local;
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister
            ((SubjectSetRegister *)&gtest_ar_.message_);
  bVar1 = bidfx_public_api::price::pixie::SubjectSetRegister::IsCurrentlySubscribed
                    ((Subject *)&gtest_ar_.message_);
  local_b1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b0,&local_b1,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar2) {
    testing::Message::Message(local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_b0,
               (AssertionResult *)"subject_register.IsCurrentlySubscribed(SS_SUBJECT0)","true",
               "false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x41,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  bVar1 = bidfx_public_api::price::pixie::SubjectSetRegister::IsCurrentlySubscribed
                    ((Subject *)&gtest_ar_.message_);
  local_109 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_108,&local_109,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar2) {
    testing::Message::Message(&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_108,
               (AssertionResult *)"subject_register.IsCurrentlySubscribed(SS_SUBJECT1)","true",
               "false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x42,pcVar3);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  bVar1 = bidfx_public_api::price::pixie::SubjectSetRegister::IsCurrentlySubscribed
                    ((Subject *)&gtest_ar_.message_);
  local_151 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_150,&local_151,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar2) {
    testing::Message::Message(&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_188,(internal *)local_150,
               (AssertionResult *)"subject_register.IsCurrentlySubscribed(SS_SUBJECT2)","true",
               "false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x43,pcVar3);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  SubjectSetRegister::~SubjectSetRegister((SubjectSetRegister *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, initially_no_subjects_are_currently_subscribed)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    EXPECT_FALSE(subject_register.IsCurrentlySubscribed(SS_SUBJECT0));
    EXPECT_FALSE(subject_register.IsCurrentlySubscribed(SS_SUBJECT1));
    EXPECT_FALSE(subject_register.IsCurrentlySubscribed(SS_SUBJECT2));
}